

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

cycle_formatter * __thiscall
cornelich::cycle_formatter::date_from_cycle_abi_cxx11_(cycle_formatter *this,int64_t cycle)

{
  bool bVar1;
  size_t sVar2;
  reference __p;
  element_type *peVar3;
  size_t in_RDX;
  shared_ptr<cornelich::cycle_formatter::node_t> local_90;
  string local_80 [32];
  undefined1 local_60 [8];
  shared_ptr<cornelich::cycle_formatter::node_t> node;
  undefined1 local_40 [8];
  shared_ptr<cornelich::cycle_formatter::node_t> cached;
  size_t hash;
  int64_t cycle_local;
  cycle_formatter *this_local;
  
  hash = in_RDX;
  cycle_local = cycle;
  this_local = this;
  sVar2 = std::hash<long>::operator()
                    ((hash<long> *)
                     ((long)&cached.
                             super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7),in_RDX);
  std::array<std::shared_ptr<cornelich::cycle_formatter::node_t>,_32UL>::operator[]
            ((array<std::shared_ptr<cornelich::cycle_formatter::node_t>,_32UL> *)(cycle + 0x10),
             sVar2 % 0x1f);
  std::atomic_load<cornelich::cycle_formatter::node_t>
            ((shared_ptr<cornelich::cycle_formatter::node_t> *)local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if ((bVar1) &&
     (peVar3 = std::
               __shared_ptr_access<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40), peVar3->m_cycle == hash)) {
    peVar3 = std::
             __shared_ptr_access<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    std::__cxx11::string::string((string *)this,(string *)&peVar3->m_data);
    node.super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
  }
  else {
    (**(code **)(*(long *)cycle + 0x18))(local_80,cycle,hash);
    std::make_shared<cornelich::cycle_formatter::node_t,long&,std::__cxx11::string>
              ((long *)local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hash);
    std::__cxx11::string::~string(local_80);
    __p = std::array<std::shared_ptr<cornelich::cycle_formatter::node_t>,_32UL>::operator[]
                    ((array<std::shared_ptr<cornelich::cycle_formatter::node_t>,_32UL> *)
                     (cycle + 0x10),sVar2 % 0x1f);
    std::shared_ptr<cornelich::cycle_formatter::node_t>::shared_ptr
              (&local_90,(shared_ptr<cornelich::cycle_formatter::node_t> *)local_60);
    std::atomic_store<cornelich::cycle_formatter::node_t>(__p,&local_90);
    std::shared_ptr<cornelich::cycle_formatter::node_t>::~shared_ptr(&local_90);
    peVar3 = std::
             __shared_ptr_access<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
    std::__cxx11::string::string((string *)this,(string *)&peVar3->m_data);
    node.super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
    std::shared_ptr<cornelich::cycle_formatter::node_t>::~shared_ptr
              ((shared_ptr<cornelich::cycle_formatter::node_t> *)local_60);
  }
  std::shared_ptr<cornelich::cycle_formatter::node_t>::~shared_ptr
            ((shared_ptr<cornelich::cycle_formatter::node_t> *)local_40);
  return this;
}

Assistant:

std::string cycle_formatter::date_from_cycle(std::int64_t cycle) const
{
    // TODO: Is it worth it...?
    auto hash = std::hash<std::int64_t>()(cycle) % (CACHE_SIZE - 1);
    auto cached = std::atomic_load(&m_cache[hash]);
    if(cached && cached->m_cycle == cycle)
    {
        // Cache hit - return the string
        return cached->m_data;
    }
    // Cache miss -> evaluate and cache the string
    auto node = std::make_shared<node_t>(cycle, date_from_cycle_impl(cycle));
    std::atomic_store(&m_cache[hash], node);
    return node->m_data;
}